

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

uint32_t trb_max_gap_to_type(trt_parent_cache ca,trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  char *pcVar1;
  char *pcVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar8;
  trt_node *ptVar9;
  trt_node *ptVar10;
  uint32_t uVar11;
  byte bVar12;
  trt_node local_f0;
  trt_node local_90;
  size_t sVar7;
  
  bVar12 = 0;
  (*(pc->fp).modify.first_sibling)(&local_f0,ca,tc);
  if ((((local_f0.iffeatures.type != TRD_IFF_NON_PRESENT) || (local_f0.type.type != TRD_TYPE_EMPTY))
      || (local_f0.name.str != (char *)0x0)) ||
     ((local_f0.flags != (char *)0x0 || (uVar11 = 0, local_f0.status != (char *)0x0)))) {
    uVar11 = 0;
    do {
      uVar3 = 0;
      if (local_f0.name.keys == '\0') {
        uVar3 = trb_gap_to_opts(&local_f0);
        pcVar1 = local_f0.name.add_opts;
        if (local_f0.name.add_opts == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          sVar7 = strlen(local_f0.name.add_opts);
          iVar4 = (int)sVar7;
        }
        pcVar2 = local_f0.name.opts;
        if (local_f0.name.opts == (char *)0x0) {
          iVar5 = 0;
        }
        else {
          sVar7 = strlen(local_f0.name.opts);
          iVar5 = (int)sVar7;
        }
        uVar6 = iVar5 + iVar4;
        if (uVar6 < 4) {
          if (pcVar1 == (char *)0x0 && pcVar2 == (char *)0x0) {
            uVar6 = 0;
          }
          uVar3 = (uVar3 - uVar6) + 4;
        }
        else {
          uVar3 = uVar3 + 1;
        }
      }
      if ((int)uVar3 < (int)uVar11) {
        uVar3 = uVar11;
      }
      uVar11 = uVar3;
      (*(pc->fp).modify.next_sibling)(&local_90,ca,tc);
      ptVar9 = &local_90;
      ptVar10 = &local_f0;
      for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
        ptVar10->status = ptVar9->status;
        ptVar9 = (trt_node *)((long)ptVar9 + (ulong)bVar12 * -0x10 + 8);
        ptVar10 = (trt_node *)((long)ptVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      }
    } while (((local_f0.iffeatures.type != TRD_IFF_NON_PRESENT) ||
             (local_f0.type.type != TRD_TYPE_EMPTY)) ||
            ((local_f0.name.str != (char *)0x0 ||
             ((local_f0.flags != (char *)0x0 || (local_f0.status != (char *)0x0))))));
  }
  (*(pc->fp).modify.first_sibling)(&local_90,ca,tc);
  return uVar11;
}

Assistant:

static uint32_t
trb_max_gap_to_type(struct trt_parent_cache ca, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    struct trt_node node;
    int32_t maxlen, len;

    maxlen = 0;
    for (node = pc->fp.modify.first_sibling(ca, tc);
            !trp_node_is_empty(&node);
            node = pc->fp.modify.next_sibling(ca, tc)) {
        len = trb_gap_to_type(&node);
        maxlen = maxlen < len ? len : maxlen;
    }
    pc->fp.modify.first_sibling(ca, tc);

    return maxlen;
}